

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O3

void __thiscall
btDbvtBroadphase::setAabb
          (btDbvtBroadphase *this,btBroadphaseProxy *absproxy,btVector3 *aabbMin,btVector3 *aabbMax,
          btDispatcher *param_4)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  btDbvtProxy *pbVar5;
  undefined4 uVar6;
  bool bVar7;
  btDbvtNode *pbVar8;
  btDbvtProxy **ppbVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  btDbvtVolume aabb;
  btVector3 velocity;
  btDbvtVolume local_68;
  undefined1 local_40 [24];
  
  local_68.mi.m_floats._0_8_ = *(undefined8 *)aabbMin->m_floats;
  local_68.mi.m_floats._8_8_ = *(undefined8 *)(aabbMin->m_floats + 2);
  local_68.mx.m_floats._0_8_ = *(undefined8 *)aabbMax->m_floats;
  local_68.mx.m_floats._8_8_ = *(undefined8 *)(aabbMax->m_floats + 2);
  if (absproxy[1].m_uniqueId == 2) {
    btDbvt::remove((btDbvt *)&this->field_0x68,(char *)absproxy[1].m_clientObject);
    pbVar8 = btDbvt::insert((btDbvt *)&this->field_0x8,&local_68,absproxy);
    absproxy[1].m_clientObject = pbVar8;
  }
  else {
    this->m_updates_call = this->m_updates_call + 1;
    pbVar8 = (btDbvtNode *)absproxy[1].m_clientObject;
    if ((((((pbVar8->volume).mi.m_floats[0] <= local_68.mx.m_floats[0]) &&
          (local_68.mi.m_floats[0] <= (pbVar8->volume).mx.m_floats[0])) &&
         ((pbVar8->volume).mi.m_floats[1] <= local_68.mx.m_floats[1])) &&
        ((local_68.mi.m_floats[1] <= (pbVar8->volume).mx.m_floats[1] &&
         ((pbVar8->volume).mi.m_floats[2] <= local_68.mx.m_floats[2])))) &&
       (local_68.mi.m_floats[2] <= (pbVar8->volume).mx.m_floats[2])) {
      fVar1 = (absproxy->m_aabbMin).m_floats[2];
      uVar2 = *(undefined8 *)(absproxy->m_aabbMin).m_floats;
      uVar3 = *(undefined8 *)(absproxy->m_aabbMax).m_floats;
      fVar11 = (float)uVar2;
      fVar12 = (float)((ulong)uVar2 >> 0x20);
      fVar14 = this->m_prediction;
      fVar10 = ((absproxy->m_aabbMax).m_floats[2] - fVar1) * 0.5 * fVar14;
      fVar13 = fVar14 * ((float)uVar3 - fVar11) * 0.5;
      fVar14 = fVar14 * ((float)((ulong)uVar3 >> 0x20) - fVar12) * 0.5;
      local_40._4_4_ = fVar14;
      local_40._0_4_ = fVar13;
      local_40._8_4_ = fVar10;
      if (aabbMin->m_floats[0] < fVar11) {
        local_40._4_8_ = local_40._4_8_;
        local_40._0_4_ = -fVar13;
      }
      if (aabbMin->m_floats[1] < fVar12) {
        uVar6 = local_40._8_4_;
        local_40._0_8_ = CONCAT44(fVar14,local_40._0_4_) ^ 0x8000000000000000;
        local_40._8_4_ = uVar6;
      }
      if (aabbMin->m_floats[2] < fVar1) {
        local_40._8_4_ = -fVar10;
      }
      local_40._12_4_ = 0;
      bVar7 = btDbvt::update((btDbvt *)&this->field_0x8,pbVar8,&local_68,(btVector3 *)local_40,0.05)
      ;
      if (bVar7) {
        this->m_updates_done = this->m_updates_done + 1;
      }
      goto LAB_001351db;
    }
    btDbvt::update((btDbvt *)&this->field_0x8,pbVar8,&local_68);
    this->m_updates_done = this->m_updates_done + 1;
  }
  bVar7 = true;
LAB_001351db:
  pbVar5 = (btDbvtProxy *)absproxy[1].m_multiSapParentProxy;
  ppbVar9 = (btDbvtProxy **)(*(long *)&absproxy[1].m_collisionFilterGroup + 0x50);
  if (*(long *)&absproxy[1].m_collisionFilterGroup == 0) {
    ppbVar9 = this->m_stageRoots + absproxy[1].m_uniqueId;
  }
  *ppbVar9 = pbVar5;
  if (pbVar5 != (btDbvtProxy *)0x0) {
    pbVar5->links[0] = *(btDbvtProxy **)&absproxy[1].m_collisionFilterGroup;
  }
  uVar2 = *(undefined8 *)(aabbMin->m_floats + 2);
  *(undefined8 *)(absproxy->m_aabbMin).m_floats = *(undefined8 *)aabbMin->m_floats;
  *(undefined8 *)((absproxy->m_aabbMin).m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(aabbMax->m_floats + 2);
  *(undefined8 *)(absproxy->m_aabbMax).m_floats = *(undefined8 *)aabbMax->m_floats;
  *(undefined8 *)((absproxy->m_aabbMax).m_floats + 2) = uVar2;
  iVar4 = this->m_stageCurrent;
  absproxy[1].m_uniqueId = iVar4;
  absproxy[1].m_collisionFilterGroup = 0;
  absproxy[1].m_collisionFilterMask = 0;
  *(undefined4 *)&absproxy[1].field_0xc = 0;
  pbVar5 = this->m_stageRoots[iVar4];
  absproxy[1].m_multiSapParentProxy = pbVar5;
  if (pbVar5 != (btDbvtProxy *)0x0) {
    pbVar5->links[0] = (btDbvtProxy *)absproxy;
  }
  this->m_stageRoots[iVar4] = (btDbvtProxy *)absproxy;
  if ((bVar7 != false) && (this->m_needcleanup = true, this->m_deferedcollide == false)) {
    local_40._8_8_ = this;
    local_40._0_8_ = &PTR__ICollide_0021b108;
    btDbvt::collideTTpersistentStack
              ((btDbvt *)&this->field_0x68,*(btDbvtNode **)&this->field_0x68,
               (btDbvtNode *)absproxy[1].m_clientObject,(ICollide *)local_40);
    btDbvt::collideTTpersistentStack
              ((btDbvt *)&this->field_0x8,*(btDbvtNode **)&this->field_0x8,
               (btDbvtNode *)absproxy[1].m_clientObject,(ICollide *)local_40);
  }
  return;
}

Assistant:

void							btDbvtBroadphase::setAabb(		btBroadphaseProxy* absproxy,
														  const btVector3& aabbMin,
														  const btVector3& aabbMax,
														  btDispatcher* /*dispatcher*/)
{
	btDbvtProxy*						proxy=(btDbvtProxy*)absproxy;
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	aabb=btDbvtVolume::FromMM(aabbMin,aabbMax);
#if DBVT_BP_PREVENTFALSEUPDATE
	if(NotEqual(aabb,proxy->leaf->volume))
#endif
	{
		bool	docollide=false;
		if(proxy->stage==STAGECOUNT)
		{/* fixed -> dynamic set	*/ 
			m_sets[1].remove(proxy->leaf);
			proxy->leaf=m_sets[0].insert(aabb,proxy);
			docollide=true;
		}
		else
		{/* dynamic set				*/ 
			++m_updates_call;
			if(Intersect(proxy->leaf->volume,aabb))
			{/* Moving				*/ 

				const btVector3	delta=aabbMin-proxy->m_aabbMin;
				btVector3		velocity(((proxy->m_aabbMax-proxy->m_aabbMin)/2)*m_prediction);
				if(delta[0]<0) velocity[0]=-velocity[0];
				if(delta[1]<0) velocity[1]=-velocity[1];
				if(delta[2]<0) velocity[2]=-velocity[2];
				if	(
#ifdef DBVT_BP_MARGIN				
					m_sets[0].update(proxy->leaf,aabb,velocity,DBVT_BP_MARGIN)
#else
					m_sets[0].update(proxy->leaf,aabb,velocity)
#endif
					)
				{
					++m_updates_done;
					docollide=true;
				}
			}
			else
			{/* Teleporting			*/ 
				m_sets[0].update(proxy->leaf,aabb);
				++m_updates_done;
				docollide=true;
			}	
		}
		listremove(proxy,m_stageRoots[proxy->stage]);
		proxy->m_aabbMin = aabbMin;
		proxy->m_aabbMax = aabbMax;
		proxy->stage	=	m_stageCurrent;
		listappend(proxy,m_stageRoots[m_stageCurrent]);
		if(docollide)
		{
			m_needcleanup=true;
			if(!m_deferedcollide)
			{
				btDbvtTreeCollider	collider(this);
				m_sets[1].collideTTpersistentStack(m_sets[1].m_root,proxy->leaf,collider);
				m_sets[0].collideTTpersistentStack(m_sets[0].m_root,proxy->leaf,collider);
			}
		}	
	}
}